

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void anon_unknown.dwarf_115aec::RenderDrawLists(ImDrawData *draw_data)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  ImDrawList *this;
  unsigned_short *puVar5;
  ImDrawVert *pIVar6;
  ImDrawCallback p_Var7;
  undefined1 auVar8 [16];
  uint uVar9;
  ImGuiIO *pIVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  long lVar13;
  int cmd_i;
  int iVar14;
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  int fb_width;
  int fb_height;
  float fVar20;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  float local_78;
  float local_68;
  
  ImGui::GetDrawData();
  if (draw_data->CmdListsCount != 0) {
    pIVar10 = ImGui::GetIO();
    if (pIVar10->Fonts->TexID == (ImTextureID)0x0) {
      __assert_fail("io.Fonts->TexID != (ImTextureID)NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                    ,0x366,"void (anonymous namespace)::RenderDrawLists(ImDrawData *)");
    }
    fb_width = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
    fb_height = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
    auVar16._0_4_ = -(uint)(fb_width == 0);
    auVar16._4_4_ = -(uint)(fb_width == 0);
    auVar16._8_4_ = -(uint)(fb_height == 0);
    auVar16._12_4_ = -(uint)(fb_height == 0);
    iVar12 = movmskpd((int)pIVar10->Fonts,auVar16);
    if (iVar12 == 0) {
      ImDrawData::ScaleClipRects(draw_data,&pIVar10->DisplayFramebufferScale);
      glGetIntegerv(0x8069,&last_texture);
      glGetIntegerv(0xb40,last_polygon_mode);
      glGetIntegerv(0xba2,last_viewport);
      glGetIntegerv(0xc10,last_scissor_box);
      glGetIntegerv(0xb54,&last_shade_model);
      glGetTexEnviv(0x2300,0x2200,&last_tex_env_mode);
      glPushAttrib(0x7000);
      SetupRenderState(draw_data,fb_width,fb_height);
      IVar2 = draw_data->DisplayPos;
      IVar3 = draw_data->FramebufferScale;
      fVar19 = IVar3.y;
      fVar17 = IVar2.y;
      for (lVar13 = 0; lVar13 < draw_data->CmdListsCount; lVar13 = lVar13 + 1) {
        this = draw_data->CmdLists[lVar13];
        puVar5 = (this->IdxBuffer).Data;
        pIVar6 = (this->VtxBuffer).Data;
        glVertexPointer(2,0x1406,0x14,pIVar6);
        glTexCoordPointer(2,0x1406,0x14,&pIVar6->uv);
        glColorPointer(4,0x1401,0x14,&pIVar6->col);
        for (iVar12 = 0; iVar12 < (this->CmdBuffer).Size; iVar12 = iVar12 + 1) {
          pIVar11 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar12);
          p_Var7 = pIVar11->UserCallback;
          if (p_Var7 == (ImDrawCallback)0x0) {
            local_68 = IVar2.x;
            local_78 = IVar3.x;
            fVar15 = ((pIVar11->ClipRect).x - local_68) * local_78;
            if ((fVar15 < (float)fb_width) &&
               (fVar18 = ((pIVar11->ClipRect).y - fVar17) * fVar19, fVar18 < (float)fb_height)) {
              uVar1 = (pIVar11->ClipRect).z;
              uVar4 = (pIVar11->ClipRect).w;
              local_78 = ((float)uVar1 - local_68) * local_78;
              fVar20 = ((float)uVar4 - fVar17) * fVar19;
              iVar14 = -(uint)(0.0 <= local_78);
              auVar8._4_4_ = iVar14;
              auVar8._0_4_ = iVar14;
              auVar8._8_4_ = -(uint)(0.0 <= fVar20);
              auVar8._12_4_ = -(uint)(0.0 <= fVar20);
              uVar9 = movmskpd(0,auVar8);
              if (((uVar9 & 1) != 0) && ((byte)((byte)uVar9 >> 1) != 0)) {
                glScissor((int)fVar15,(int)((float)fb_height - fVar20),(int)(local_78 - fVar15),
                          (int)(fVar20 - fVar18));
                glBindTexture(0xde1,*(undefined4 *)&pIVar11->TextureId);
                glDrawElements(4,pIVar11->ElemCount,0x1403,puVar5 + pIVar11->IdxOffset);
              }
            }
          }
          else if (p_Var7 == (ImDrawCallback)0xffffffffffffffff) {
            SetupRenderState(draw_data,fb_width,fb_height);
          }
          else {
            (*p_Var7)(this,pIVar11);
          }
        }
      }
      glDisableClientState(0x8076);
      glDisableClientState(0x8078);
      glDisableClientState(0x8074);
      glBindTexture(0xde1,last_texture);
      glMatrixMode(0x1700);
      glPopMatrix();
      glMatrixMode(0x1701);
      glPopMatrix();
      glPopAttrib();
      glPolygonMode(0x404,last_polygon_mode[0]);
      glPolygonMode(0x405,last_polygon_mode[1]);
      glViewport(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
      glScissor(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],last_scissor_box[3]);
      glShadeModel(last_shade_model);
      glTexEnvi(0x2300,0x2200,last_tex_env_mode);
    }
  }
  return;
}

Assistant:

void RenderDrawLists(ImDrawData* draw_data) {
    ImGui::GetDrawData();
    if (draw_data->CmdListsCount == 0) {
        return;
    }

    ImGuiIO& io = ImGui::GetIO();
    assert(io.Fonts->TexID != (ImTextureID)NULL); // You forgot to create and set font texture

    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates !=
    // framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0) return;
    draw_data->ScaleClipRects(io.DisplayFramebufferScale);

    // Backup GL state
    // Backup GL state
    GLint last_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2];
    glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4];
    glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4];
    glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model;
    glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode;
    glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);

#ifdef GL_VERSION_ES_CL_1_1
    GLint last_array_buffer;
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    GLint last_element_array_buffer;
    glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
#else
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);
#endif

    // Setup desired GL state
    SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos; // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are
                                                     // often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++) {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert),
                        (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert),
                          (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert),
                       (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++) {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback) {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to
                // request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            } else {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f &&
                    clip_rect.w >= 0.0f) {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w),
                              (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    GLuint textureHandle = convertImTextureIDToGLTextureHandle(pcmd->TextureId);
                    glBindTexture(GL_TEXTURE_2D, textureHandle);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount,
                                   sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT,
                                   idx_buffer + pcmd->IdxOffset);
                }
            }
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]);
    glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2],
               (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2],
              (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);

#ifdef GL_VERSION_ES_CL_1_1
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    glDisable(GL_SCISSOR_TEST);
#endif
}